

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_order.c
# Opt level: O0

void rhash_swap_copy_str_to_u64(void *to,int index,void *from,size_t length)

{
  ulong uVar1;
  undefined1 *local_48;
  char *src_1;
  uint64_t *dst;
  uint64_t *end;
  uint64_t *src;
  size_t length_local;
  void *from_local;
  int index_local;
  void *to_local;
  
  if ((((long)(int)to | (ulong)from | (long)index | length) & 7) == 0) {
    src_1 = (char *)((long)to + (long)index);
    end = (uint64_t *)from;
    while (end < (uint64_t *)((long)from + length)) {
      uVar1 = *end;
      *(ulong *)src_1 =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      src_1 = src_1 + 8;
      end = end + 1;
    }
  }
  else {
    local_48 = (undefined1 *)from;
    for (from_local._4_4_ = index; (ulong)(long)(int)from_local._4_4_ < (long)index + length;
        from_local._4_4_ = from_local._4_4_ + 1) {
      *(undefined1 *)((long)to + (long)(int)(from_local._4_4_ ^ 7)) = *local_48;
      local_48 = local_48 + 1;
    }
  }
  return;
}

Assistant:

void rhash_swap_copy_str_to_u64(void* to, int index, const void* from, size_t length)
{
	/* if all pointers and length are 64-bits aligned */
	if ( 0 == (( (int)((char*)to - (char*)0) | ((char*)from - (char*)0) | index | length ) & 7) ) {
		/* copy aligned memory block as 64-bit integers */
		const uint64_t* src = (const uint64_t*)from;
		const uint64_t* end = (const uint64_t*)((const char*)src + length);
		uint64_t* dst = (uint64_t*)((char*)to + index);
		while (src < end) *(dst++) = bswap_64( *(src++) );
	} else {
		const char* src = (const char*)from;
		for (length += index; (size_t)index < length; index++) ((char*)to)[index ^ 7] = *(src++);
	}
}